

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool P_LoadGLNodes(MapData *map)

{
  MapData *__dest;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  FWadLump *pFVar6;
  long *plVar7;
  FileReader *pFVar8;
  uint local_1b4;
  uint local_1b0;
  uint i_2;
  uint i_1;
  bool result;
  char *ext;
  int i;
  char *name;
  FResourceFile *f_gwa;
  bool mapinwad;
  int lumpfile;
  int li;
  char path [256];
  FileReader *gwalumps [4];
  CRecoverableError *anon_var_0;
  DWORD local_34 [2];
  int id;
  int idcheck3b;
  int idcheck2b;
  int idcheck1b;
  int idcheck3a;
  int idcheck2a;
  int idcheck1a;
  MapData *map_local;
  
  _idcheck2a = map;
  if ((map->MapLumps[6].Reader != (FileReader *)0x0) &&
     (lVar4 = FileReader::GetLength(map->MapLumps[6].Reader), lVar4 != 0)) {
    idcheck3a = 0x4e4c475a;
    idcheck1b = 0x324c475a;
    idcheck2b = 0x334c475a;
    idcheck3b = 0x4e4c4758;
    id = 0x324c4758;
    local_34[1] = 0x334c4758;
    MapData::Seek(_idcheck2a,6);
    (*(_idcheck2a->file->super_FileReaderBase)._vptr_FileReaderBase[2])(_idcheck2a->file,local_34,4)
    ;
    if ((local_34[0] == 0x4e4c475a) ||
       ((((local_34[0] == 0x324c475a || (local_34[0] == 0x334c475a)) || (local_34[0] == 0x4e4c4758))
        || ((local_34[0] == 0x324c4758 || (local_34[0] == 0x334c4758)))))) {
      subsectors = (subsector_t *)0x0;
      segs = (seg_t *)0x0;
      nodes = (node_t *)0x0;
      P_LoadZNodes(_idcheck2a->file,local_34[0]);
      return true;
    }
  }
  bVar1 = CheckCachedNodes(_idcheck2a);
  if (bVar1) {
    map_local._7_1_ = true;
  }
  else {
    memset(path + 0xf8,0,0x20);
    iVar2 = FWadCollection::GetLumpFile(&Wads,_idcheck2a->lumpnum);
    bVar1 = _idcheck2a->InWad;
    name = (char *)_idcheck2a->resource;
    pcVar5 = FWadCollection::GetWadFullName(&Wads,iVar2);
    if ((bVar1 & 1U) != 0) {
      iVar2 = FindGLNodesInWAD(_idcheck2a->lumpnum);
      if (-1 < iVar2) {
        for (ext._4_4_ = 0; ext._4_4_ < 4; ext._4_4_ = ext._4_4_ + 1) {
          pFVar6 = FWadCollection::ReopenLumpNum(&Wads,iVar2 + ext._4_4_ + 1);
          gwalumps[(long)ext._4_4_ + -1] = &pFVar6->super_FileReader;
        }
        bVar1 = DoLoadGLNodes((FileReader **)(path + 0xf8));
        return bVar1;
      }
      strcpy((char *)&lumpfile,pcVar5);
      pcVar5 = strrchr((char *)&lumpfile,0x2e);
      if (pcVar5 != (char *)0x0) {
        strcpy(pcVar5,".gwa");
        name = (char *)FResourceFile::OpenResourceFile
                                 ((char *)&lumpfile,(FileReader *)0x0,true,false);
        __dest = _idcheck2a;
        if ((FResourceFile *)name == (FResourceFile *)0x0) {
          return false;
        }
        pcVar5 = FWadCollection::GetLumpFullName(&Wads,_idcheck2a->lumpnum);
        strncpy((char *)__dest,pcVar5,8);
      }
    }
    i_2._3_1_ = false;
    iVar2 = FindGLNodesInFile((FResourceFile *)name,(char *)_idcheck2a);
    if (iVar2 != -1) {
      i_2._3_1_ = true;
      for (local_1b0 = 0; local_1b0 < 4; local_1b0 = local_1b0 + 1) {
        lVar4 = (**(code **)(*(long *)name + 0x20))(name,iVar2 + local_1b0 + 1);
        iVar3 = strncasecmp((char *)(lVar4 + 0x18),P_LoadGLNodes::check[local_1b0],8);
        if (iVar3 != 0) {
          i_2._3_1_ = false;
          break;
        }
        plVar7 = (long *)(**(code **)(*(long *)name + 0x20))(name,iVar2 + local_1b0 + 1);
        pFVar8 = (FileReader *)(**(code **)(*plVar7 + 0x18))();
        gwalumps[(ulong)local_1b0 - 1] = pFVar8;
      }
      if (i_2._3_1_ != false) {
        i_2._3_1_ = DoLoadGLNodes((FileReader **)(path + 0xf8));
      }
    }
    if (((FResourceFile *)name != _idcheck2a->resource) && (name != (char *)0x0)) {
      (**(code **)(*(long *)name + 8))();
    }
    for (local_1b4 = 0; local_1b4 < 4; local_1b4 = local_1b4 + 1) {
      if (gwalumps[(ulong)local_1b4 - 1] != (FileReader *)0x0) {
        (*(gwalumps[(ulong)local_1b4 - 1]->super_FileReaderBase)._vptr_FileReaderBase[1])();
      }
    }
    map_local._7_1_ = i_2._3_1_;
  }
  return map_local._7_1_;
}

Assistant:

bool P_LoadGLNodes(MapData * map)
{
	if (map->MapLumps[ML_GLZNODES].Reader && map->MapLumps[ML_GLZNODES].Reader->GetLength() != 0)
	{
		const int idcheck1a = MAKE_ID('Z','G','L','N');
		const int idcheck2a = MAKE_ID('Z','G','L','2');
		const int idcheck3a = MAKE_ID('Z','G','L','3');
		const int idcheck1b = MAKE_ID('X','G','L','N');
		const int idcheck2b = MAKE_ID('X','G','L','2');
		const int idcheck3b = MAKE_ID('X','G','L','3');
		int id;

		map->Seek(ML_GLZNODES);
		map->file->Read (&id, 4);
		if (id == idcheck1a || id == idcheck2a || id == idcheck3a ||
			id == idcheck1b || id == idcheck2b || id == idcheck3b)
		{
			try
			{
				subsectors = NULL;
				segs = NULL;
				nodes = NULL;
				P_LoadZNodes (*map->file, id);
				return true;
			}
			catch (CRecoverableError &)
			{
				if (subsectors != NULL)
				{
					delete[] subsectors;
					subsectors = NULL;
				}
				if (segs != NULL)
				{
					delete[] segs;
					segs = NULL;
				}
				if (nodes != NULL)
				{
					delete[] nodes;
					nodes = NULL;
				}
			}
		}
	}

	if (!CheckCachedNodes(map))
	{
		FileReader *gwalumps[4] = { NULL, NULL, NULL, NULL };
		char path[256];
		int li;
		int lumpfile = Wads.GetLumpFile(map->lumpnum);
		bool mapinwad = map->InWad;
		FResourceFile * f_gwa = map->resource;

		const char * name = Wads.GetWadFullName(lumpfile);

		if (mapinwad)
		{
			li = FindGLNodesInWAD(map->lumpnum);

			if (li>=0)
			{
				// GL nodes are loaded with a WAD
				for(int i=0;i<4;i++)
				{
					gwalumps[i]=Wads.ReopenLumpNum(li+i+1);
				}
				return DoLoadGLNodes(gwalumps);
			}
			else
			{
				strcpy(path, name);

				char * ext = strrchr(path, '.');
				if (ext)
				{
					strcpy(ext, ".gwa");
					// Todo: Compare file dates

					f_gwa = FResourceFile::OpenResourceFile(path, NULL, true);
					if (f_gwa==NULL) return false;

					strncpy(map->MapLumps[0].Name, Wads.GetLumpFullName(map->lumpnum), 8);
				}
			}
		}

		bool result = false;
		li = FindGLNodesInFile(f_gwa, map->MapLumps[0].Name);
		if (li!=-1)
		{
			static const char check[][9]={"GL_VERT","GL_SEGS","GL_SSECT","GL_NODES"};
			result=true;
			for(unsigned i=0; i<4;i++)
			{
				if (strnicmp(f_gwa->GetLump(li+i+1)->Name, check[i], 8))
				{
					result=false;
					break;
				}
				else
					gwalumps[i] = f_gwa->GetLump(li+i+1)->NewReader();
			}
			if (result) result = DoLoadGLNodes(gwalumps);
		}

		if (f_gwa != map->resource)
			delete f_gwa;
		for(unsigned int i = 0;i < 4;++i)
			delete gwalumps[i];
		return result;
	}
	else return true;
}